

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2sparse.c
# Opt level: O3

void mod2sparse_add(mod2sparse *m1,mod2sparse *m2,mod2sparse *r)

{
  byte *pbVar1;
  int col;
  uint uVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  mod2entry *pmVar6;
  mod2sparse *r_00;
  void *__s;
  mod2entry *pmVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  
  if ((((m1->n_rows == r->n_rows) && (m1->n_cols == r->n_cols)) && (m2->n_rows == m1->n_rows)) &&
     (m2->n_cols == m1->n_cols)) {
    if ((r != m1) && (r != m2)) {
      mod2sparse_clear(r);
      if (r->n_rows < 1) {
        return;
      }
      lVar9 = 0;
LAB_00121cf6:
      pmVar6 = m1->rows[lVar9].right;
      pmVar7 = m2->rows[lVar9].right;
      while (iVar8 = (int)lVar9, -1 < pmVar6->row) {
        if (pmVar7->row < 0) goto LAB_00121d4a;
        iVar4 = pmVar6->col;
        col = pmVar7->col;
        if (iVar4 == col) {
          pmVar6 = pmVar6->right;
LAB_00121d44:
          pmVar7 = pmVar7->right;
        }
        else {
          if (col <= iVar4) {
            mod2sparse_insert(r,iVar8,col);
            goto LAB_00121d44;
          }
          mod2sparse_insert(r,iVar8,iVar4);
          pmVar6 = pmVar6->right;
        }
      }
      goto LAB_00121d77;
    }
  }
  else {
    mod2sparse_add_cold_1();
  }
  mod2sparse_add_cold_2();
  if (((m1->n_cols == m2->n_rows) && (m1->n_rows == r_00->n_rows)) && (m2->n_cols == r_00->n_cols))
  {
    if ((r_00 != m1) && (r_00 != m2)) {
      mod2sparse_clear(r_00);
      iVar8 = m1->n_rows;
      if (0 < iVar8) {
        lVar9 = 0;
        do {
          if ((-1 < (m1->rows[lVar9].right)->row) && (iVar4 = m2->n_cols, 0 < iVar4)) {
            lVar10 = 0;
            do {
              pmVar6 = m1->rows[lVar9].right;
              if (-1 < pmVar6->row) {
                pmVar7 = m2->cols[lVar10].down;
                bVar3 = false;
                do {
                  iVar8 = pmVar7->row;
                  if (iVar8 < 0) break;
                  if (pmVar6->col == iVar8) {
                    bVar3 = (bool)(bVar3 ^ 1);
                    pmVar6 = pmVar6->right;
LAB_00121e59:
                    pmVar7 = pmVar7->down;
                  }
                  else {
                    if (iVar8 <= pmVar6->col) goto LAB_00121e59;
                    pmVar6 = pmVar6->right;
                  }
                } while (-1 < pmVar6->row);
                if (bVar3) {
                  mod2sparse_insert(r_00,(int)lVar9,(int)lVar10);
                  iVar4 = m2->n_cols;
                }
              }
              lVar10 = lVar10 + 1;
            } while (lVar10 < iVar4);
            iVar8 = m1->n_rows;
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 < iVar8);
      }
      return;
    }
  }
  else {
    mod2sparse_multiply_cold_1();
  }
  mod2sparse_multiply_cold_2();
  uVar2 = m1->n_cols;
  if (0 < (long)m1->n_rows) {
    memset(__s,0,(long)m1->n_rows);
  }
  if (0 < (int)uVar2) {
    uVar5 = 0;
    do {
      if (*(char *)((long)&m2->n_rows + uVar5) != '\0') {
        for (pmVar6 = m1->cols[uVar5].down; -1 < pmVar6->row; pmVar6 = pmVar6->down) {
          pbVar1 = (byte *)((long)__s + (ulong)(uint)pmVar6->row);
          *pbVar1 = *pbVar1 ^ 1;
        }
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != uVar2);
  }
  return;
LAB_00121d4a:
  do {
    mod2sparse_insert(r,iVar8,pmVar6->col);
    pmVar6 = pmVar6->right;
  } while (-1 < pmVar6->row);
LAB_00121d77:
  for (; -1 < pmVar7->row; pmVar7 = pmVar7->right) {
    mod2sparse_insert(r,iVar8,pmVar7->col);
  }
  lVar9 = lVar9 + 1;
  if (r->n_rows <= lVar9) {
    return;
  }
  goto LAB_00121cf6;
}

Assistant:

void mod2sparse_add
( mod2sparse *m1,	/* Left operand of add */
  mod2sparse *m2,	/* Right operand of add */
  mod2sparse *r		/* Place to store result of add */
)
{
  mod2entry *e1, *e2;
  int i;

  if (mod2sparse_rows(m1)!=mod2sparse_rows(r) 
   || mod2sparse_cols(m1)!=mod2sparse_cols(r) 
   || mod2sparse_rows(m2)!=mod2sparse_rows(r)
   || mod2sparse_cols(m2)!=mod2sparse_cols(r)) 
  { fprintf(stderr,"mod2sparse_add: Matrices have different dimensions\n");
    exit(1);
  }

  if (r==m1 || r==m2)
  { fprintf(stderr,
     "mod2sparse_add: Result matrix is the same as one of the operands\n");
    exit(1);
  }

  mod2sparse_clear(r);

  for (i = 0; i<mod2sparse_rows(r); i++)
  { 
    e1 = mod2sparse_first_in_row(m1,i);
    e2 = mod2sparse_first_in_row(m2,i);

    while (!mod2sparse_at_end(e1) && !mod2sparse_at_end(e2))
    { 
      if (mod2sparse_col(e1)==mod2sparse_col(e2))
      { e1 = mod2sparse_next_in_row(e1);
        e2 = mod2sparse_next_in_row(e2); 
      }

      else if (mod2sparse_col(e1)<mod2sparse_col(e2))
      { mod2sparse_insert(r,i,mod2sparse_col(e1));
        e1 = mod2sparse_next_in_row(e1);
      }

      else
      { mod2sparse_insert(r,i,mod2sparse_col(e2));
        e2 = mod2sparse_next_in_row(e2);       
      }
    }

    while (!mod2sparse_at_end(e1))
    { mod2sparse_insert(r,i,mod2sparse_col(e1));
      e1 = mod2sparse_next_in_row(e1);
    }

    while (!mod2sparse_at_end(e2))
    { mod2sparse_insert(r,i,mod2sparse_col(e2));
      e2 = mod2sparse_next_in_row(e2);
    }
  }
}